

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

void decApplyRound(decNumber *dn,decContext *set,int32_t residue,uint32_t *status)

{
  uint8_t *puVar1;
  uint uVar2;
  uint local_6c;
  uint local_54;
  uint32_t count_1;
  uint8_t *sup;
  uint8_t *up_1;
  uint8_t *puStack_38;
  uint32_t count;
  uint8_t *up;
  int32_t lsd5;
  int32_t bump;
  uint32_t *status_local;
  int32_t residue_local;
  decContext *set_local;
  decNumber *dn_local;
  
  if (residue != 0) {
    up._4_4_ = 0;
    switch(set->round) {
    case DEC_ROUND_CEILING:
      if ((dn->bits & 0x80) == 0) {
        up._4_4_ = (uint)(0 < residue);
      }
      else if (residue < 0) {
        up._4_4_ = 0xffffffff;
      }
      break;
    case DEC_ROUND_UP:
      up._4_4_ = (uint)(0 < residue);
      break;
    case DEC_ROUND_HALF_UP:
      up._4_4_ = (uint)(4 < residue);
      break;
    case DEC_ROUND_HALF_EVEN:
      if (residue < 6) {
        if (residue == 5) {
          up._4_4_ = (uint)((dn->lsu[0] & 1) != 0);
        }
      }
      else {
        up._4_4_ = 1;
      }
      break;
    case DEC_ROUND_HALF_DOWN:
      up._4_4_ = (uint)(5 < residue);
      break;
    case DEC_ROUND_DOWN:
      if (residue < 0) {
        up._4_4_ = 0xffffffff;
      }
      break;
    case DEC_ROUND_FLOOR:
      if ((dn->bits & 0x80) == 0) {
        if (residue < 0) {
          up._4_4_ = 0xffffffff;
        }
      }
      else {
        up._4_4_ = (uint)(0 < residue);
      }
      break;
    case DEC_ROUND_05UP:
      uVar2 = (uint)dn->lsu[0] % 5;
      if ((residue < 0) && (uVar2 != 1)) {
        up._4_4_ = 0xffffffff;
      }
      else if ((0 < residue) && (uVar2 == 0)) {
        up._4_4_ = 1;
      }
      break;
    default:
      *status = *status | 0x40;
    }
    if (up._4_4_ != 0) {
      if ((int)up._4_4_ < 1) {
        sup = dn->lsu;
        for (local_54 = dn->digits; puVar1 = sup, 1 < local_54; local_54 = local_54 - 1) {
          if (*sup != '\0') goto LAB_002bc9c8;
          sup = sup + 1;
        }
        if ((uint)*sup == DECPOWERS[local_54 - 1]) {
          *sup = (char)DECPOWERS[local_54] + 0xff;
          while (sup = sup + -1, dn->lsu <= sup) {
            *sup = '\t';
          }
          dn->exponent = dn->exponent + -1;
          if (dn->exponent + 1 != (set->emin - set->digits) + 1) {
            return;
          }
          if ((local_54 == 1) && (dn->digits == 1)) {
            *puVar1 = '\0';
          }
          else {
            *puVar1 = (char)DECPOWERS[local_54 - 1] + 0xff;
            dn->digits = dn->digits + -1;
          }
          dn->exponent = dn->exponent + 1;
          *status = *status | 0x3820;
          return;
        }
      }
      else {
        puStack_38 = dn->lsu;
        for (up_1._4_4_ = dn->digits; 1 < up_1._4_4_; up_1._4_4_ = up_1._4_4_ - 1) {
          if (*puStack_38 != 9) goto LAB_002bc9c8;
          puStack_38 = puStack_38 + 1;
        }
        if ((uint)*puStack_38 == DECPOWERS[up_1._4_4_] - 1) {
          *puStack_38 = (byte)DECPOWERS[up_1._4_4_ - 1];
          while (puStack_38 = puStack_38 + -1, dn->lsu <= puStack_38) {
            *puStack_38 = 0;
          }
          dn->exponent = dn->exponent + 1;
          if (dn->exponent + dn->digits <= set->emax + 1) {
            return;
          }
          decSetOverflow(dn,set,status);
          return;
        }
      }
LAB_002bc9c8:
      if (dn->digits < 0x32) {
        local_6c = (uint)""[dn->digits];
      }
      else {
        local_6c = dn->digits / 1;
      }
      decUnitAddSub(dn->lsu,local_6c,"\x01",1,0,dn->lsu,up._4_4_);
    }
  }
  return;
}

Assistant:

static void decApplyRound(decNumber *dn, decContext *set, Int residue,
                          uInt *status) {
  Int  bump;                  /* 1 if coefficient needs to be incremented  */
                              /* -1 if coefficient needs to be decremented  */

  if (residue==0) return;     /* nothing to apply  */

  bump=0;                     /* assume a smooth ride  */

  /* now decide whether, and how, to round, depending on mode  */
  switch (set->round) {
    case DEC_ROUND_05UP: {    /* round zero or five up (for reround)  */
      /* This is the same as DEC_ROUND_DOWN unless there is a  */
      /* positive residue and the lsd of dn is 0 or 5, in which case  */
      /* it is bumped; when residue is <0, the number is therefore  */
      /* bumped down unless the final digit was 1 or 6 (in which  */
      /* case it is bumped down and then up -- a no-op)  */
      Int lsd5=*dn->lsu%5;     /* get lsd and quintate  */
      if (residue<0 && lsd5!=1) bump=-1;
       else if (residue>0 && lsd5==0) bump=1;
      /* [bump==1 could be applied directly; use common path for clarity]  */
      break;} /* r-05  */

    case DEC_ROUND_DOWN: {
      /* no change, except if negative residue  */
      if (residue<0) bump=-1;
      break;} /* r-d  */

    case DEC_ROUND_HALF_DOWN: {
      if (residue>5) bump=1;
      break;} /* r-h-d  */

    case DEC_ROUND_HALF_EVEN: {
      if (residue>5) bump=1;            /* >0.5 goes up  */
       else if (residue==5) {           /* exactly 0.5000...  */
        /* 0.5 goes up iff [new] lsd is odd  */
        if (*dn->lsu & 0x01) bump=1;
        }
      break;} /* r-h-e  */

    case DEC_ROUND_HALF_UP: {
      if (residue>=5) bump=1;
      break;} /* r-h-u  */

    case DEC_ROUND_UP: {
      if (residue>0) bump=1;
      break;} /* r-u  */

    case DEC_ROUND_CEILING: {
      /* same as _UP for positive numbers, and as _DOWN for negatives  */
      /* [negative residue cannot occur on 0]  */
      if (decNumberIsNegative(dn)) {
        if (residue<0) bump=-1;
        }
       else {
        if (residue>0) bump=1;
        }
      break;} /* r-c  */

    case DEC_ROUND_FLOOR: {
      /* same as _UP for negative numbers, and as _DOWN for positive  */
      /* [negative residue cannot occur on 0]  */
      if (!decNumberIsNegative(dn)) {
        if (residue<0) bump=-1;
        }
       else {
        if (residue>0) bump=1;
        }
      break;} /* r-f  */

    default: {      /* e.g., DEC_ROUND_MAX  */
      *status|=DEC_Invalid_context;
      #if DECTRACE || (DECCHECK && DECVERB)
      printf("Unknown rounding mode: %d\n", set->round);
      #endif
      break;}
    } /* switch  */

  /* now bump the number, up or down, if need be  */
  if (bump==0) return;                       /* no action required  */

  /* Simply use decUnitAddSub unless bumping up and the number is  */
  /* all nines.  In this special case set to 100... explicitly  */
  /* and adjust the exponent by one (as otherwise could overflow  */
  /* the array)  */
  /* Similarly handle all-nines result if bumping down.  */
  if (bump>0) {
    Unit *up;                                /* work  */
    uInt count=dn->digits;                   /* digits to be checked  */
    for (up=dn->lsu; ; up++) {
      if (count<=DECDPUN) {
        /* this is the last Unit (the msu)  */
        if (*up!=powers[count]-1) break;     /* not still 9s  */
        /* here if it, too, is all nines  */
        *up=(Unit)powers[count-1];           /* here 999 -> 100 etc.  */
        for (up=up-1; up>=dn->lsu; up--) *up=0; /* others all to 0  */
        dn->exponent++;                      /* and bump exponent  */
        /* [which, very rarely, could cause Overflow...]  */
        if ((dn->exponent+dn->digits)>set->emax+1) {
          decSetOverflow(dn, set, status);
          }
        return;                              /* done  */
        }
      /* a full unit to check, with more to come  */
      if (*up!=DECDPUNMAX) break;            /* not still 9s  */
      count-=DECDPUN;
      } /* up  */
    } /* bump>0  */
   else {                                    /* -1  */
    /* here checking for a pre-bump of 1000... (leading 1, all  */
    /* other digits zero)  */
    Unit *up, *sup;                          /* work  */
    uInt count=dn->digits;                   /* digits to be checked  */
    for (up=dn->lsu; ; up++) {
      if (count<=DECDPUN) {
        /* this is the last Unit (the msu)  */
        if (*up!=powers[count-1]) break;     /* not 100..  */
        /* here if have the 1000... case  */
        sup=up;                              /* save msu pointer  */
        *up=(Unit)powers[count]-1;           /* here 100 in msu -> 999  */
        /* others all to all-nines, too  */
        for (up=up-1; up>=dn->lsu; up--) *up=(Unit)powers[DECDPUN]-1;
        dn->exponent--;                      /* and bump exponent  */

        /* iff the number was at the subnormal boundary (exponent=etiny)  */
        /* then the exponent is now out of range, so it will in fact get  */
        /* clamped to etiny and the final 9 dropped.  */
        /* printf(">> emin=%d exp=%d sdig=%d\n", set->emin,  */
        /*        dn->exponent, set->digits);  */
        if (dn->exponent+1==set->emin-set->digits+1) {
          if (count==1 && dn->digits==1) *sup=0;  /* here 9 -> 0[.9]  */
           else {
            *sup=(Unit)powers[count-1]-1;    /* here 999.. in msu -> 99..  */
            dn->digits--;
            }
          dn->exponent++;
          *status|=DEC_Underflow | DEC_Subnormal | DEC_Inexact | DEC_Rounded;
          }
        return;                              /* done  */
        }

      /* a full unit to check, with more to come  */
      if (*up!=0) break;                     /* not still 0s  */
      count-=DECDPUN;
      } /* up  */

    } /* bump<0  */

  /* Actual bump needed.  Do it.  */
  decUnitAddSub(dn->lsu, D2U(dn->digits), uarrone, 1, 0, dn->lsu, bump);
  }